

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  cmLocalGenerator *lg_00;
  cmMakefile *mf_00;
  TargetTypes targetTypes_00;
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *this_00;
  reference ppcVar4;
  reference ppcVar5;
  cmGeneratorTarget *this_01;
  mapped_type *ppcVar6;
  uint local_9c;
  uint i_1;
  cmGeneratorTarget *gt;
  cmLocalGenerator *lg;
  cmTarget *ownedImpTgt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range2;
  cmMakefile *mf;
  undefined1 local_48 [4];
  uint i;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  importedMap;
  TargetTypes targetTypes_local;
  cmGlobalGenerator *this_local;
  
  importedMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = targetTypes;
  std::
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::map((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
         *)local_48);
  mf._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::size(&this->Makefiles);
    if (sVar2 <= mf._4_4_) break;
    ppcVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,(ulong)mf._4_4_);
    this_00 = cmMakefile::GetOwnedImportedTargets(*ppcVar3);
    __end2 = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin(this_00);
    ownedImpTgt = (cmTarget *)std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                                  *)&ownedImpTgt);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                ::operator*(&__end2);
      lg = (cmLocalGenerator *)*ppcVar4;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)mf._4_4_);
      lg_00 = *ppcVar5;
      this_01 = (cmGeneratorTarget *)operator_new(0x5a8);
      cmGeneratorTarget::cmGeneratorTarget(this_01,(cmTarget *)lg,lg_00);
      cmLocalGenerator::AddOwnedImportedGeneratorTarget(lg_00,this_01);
      ppcVar6 = std::
                map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                ::operator[]((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                              *)local_48,(key_type *)&lg);
      *ppcVar6 = this_01;
      __gnu_cxx::
      __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
      operator++(&__end2);
    }
    mf._4_4_ = mf._4_4_ + 1;
  }
  local_9c = 0;
  while( true ) {
    sVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    targetTypes_00 = importedMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    if (sVar2 <= local_9c) break;
    ppcVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,(ulong)local_9c);
    mf_00 = *ppcVar3;
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)local_9c);
    CreateGeneratorTargets
              (this,targetTypes_00,mf_00,*ppcVar5,
               (map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)local_48);
    local_9c = local_9c + 1;
  }
  std::
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~map((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *)local_48);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(TargetTypes targetTypes)
{
  std::map<cmTarget*, cmGeneratorTarget*> importedMap;
  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    cmMakefile* mf = this->Makefiles[i];
    for (cmTarget* ownedImpTgt : mf->GetOwnedImportedTargets()) {
      cmLocalGenerator* lg = this->LocalGenerators[i];
      cmGeneratorTarget* gt = new cmGeneratorTarget(ownedImpTgt, lg);
      lg->AddOwnedImportedGeneratorTarget(gt);
      importedMap[ownedImpTgt] = gt;
    }
  }

  // Construct per-target generator information.
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->CreateGeneratorTargets(targetTypes, this->Makefiles[i],
                                 this->LocalGenerators[i], importedMap);
  }
}